

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::normalize(char *ext)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  char *in_RDI;
  int nonzero_idx;
  int all_zero;
  int prec;
  int idx;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_18;
  uint shift;
  
  sVar5 = get_prec((char *)0x2bfab3);
  iVar1 = (int)sVar5;
  local_18 = 0;
  iVar2 = is_nan((char *)0x2bfac9);
  if (iVar2 == 0) {
    shift = 1;
    for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      uVar3 = get_dig(in_RDI,(long)iVar2);
      if (uVar3 != 0) {
        shift = 0;
        local_18 = iVar2;
        break;
      }
    }
    if ((shift == 0) && (iVar4 = get_exp("+D$\x10="), -0x8001 < iVar4 - local_18)) {
      in_RDI[4] = in_RDI[4] & 0xf7;
      if (local_18 != 0) {
        shift_left((char *)CONCAT44(iVar2,iVar1),shift);
      }
      get_exp((char *)0x2bfb82);
      set_exp(in_RDI,in_stack_ffffffffffffffdc);
    }
    else {
      set_zero(in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::normalize(char *ext)
{
    int idx;
    int prec = get_prec(ext);
    int all_zero;
    int nonzero_idx = 0;

    /* no work is necessary for anything but ordinary numbers */
    if (is_nan(ext))
        return;

    /* check for an all-zero mantissa */
    for (all_zero = TRUE, idx = 0 ; idx < prec ; ++idx)
    {
        /* check this digit */
        if (get_dig(ext, idx) != 0)
        {
            /* note the location of the first non-zero digit */
            nonzero_idx = idx;

            /* note that the number isn't all zeros */
            all_zero = FALSE;

            /* no need to keep searching */
            break;
        }
    }

    /* if it's zero or underflows, set the canonical zero format */
    if (all_zero || get_exp(ext) - nonzero_idx < -32768)
    {
        /* set the value to zero */
        set_zero(ext);
    }
    else
    {
        /* clear the zero flag */
        ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;

        /* shift the mantissa left to make the first digit non-zero */
        if (nonzero_idx != 0)
            shift_left(ext, nonzero_idx);

        /* decrease the exponent to account for the mantissa shift */
        set_exp(ext, get_exp(ext) - nonzero_idx);
    }
}